

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpcommon.c
# Opt level: O3

_Bool sftp_recv_finish(sftp_packet *pkt)

{
  size_t sVar1;
  byte bVar2;
  
  sVar1 = pkt->length;
  pkt->binarysource_[0].data = pkt->data;
  pkt->binarysource_[0].len = sVar1;
  pkt->binarysource_[0].pos = 0;
  pkt->binarysource_[0].err = BSE_NO_ERROR;
  pkt->binarysource_[0].binarysource_ = pkt->binarysource_;
  bVar2 = BinarySource_get_byte(pkt->binarysource_);
  pkt->type = (uint)bVar2;
  return pkt->binarysource_[0].err == BSE_NO_ERROR;
}

Assistant:

bool sftp_recv_finish(struct sftp_packet *pkt)
{
    BinarySource_INIT(pkt, pkt->data, pkt->length);
    pkt->type = get_byte(pkt);
    return !get_err(pkt);
}